

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
helics::apps::AppTextParser::preParseFile
          (AppTextParser *this,vector<char,_std::allocator<char>_> *klines)

{
  bool bVar1;
  bool bVar2;
  istream *piVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  const_reference pvVar9;
  vector<char,_std::allocator<char>_> *in_RDX;
  long in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  size_t ii;
  size_type firstChar;
  bool inMline;
  string str;
  vector<int,_std::allocator<int>_> *counts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  reference in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<int> local_1a;
  byte local_19;
  vector<char,_std::allocator<char>_> *local_18;
  
  local_18 = in_RDX;
  reset((AppTextParser *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  local_19 = 0;
  CLI::std::vector<char,_std::allocator<char>_>::size(local_18);
  CLI::std::allocator<int>::allocator((allocator<int> *)0x2076a9);
  CLI::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,
             (size_type)in_stack_fffffffffffffef8,(allocator_type *)in_stack_fffffffffffffef0);
  CLI::std::allocator<int>::~allocator(&local_1a);
  std::__cxx11::string::string(in_stack_fffffffffffffef0);
  bVar1 = false;
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(in_RSI + 8),(string *)&local_50);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20773e);
    if ((!bVar2) &&
       (sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find_first_not_of(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
                                    (size_type)in_stack_fffffffffffffef0),
       sVar4 != 0xffffffffffffffff)) {
      if (bVar1) {
        sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(&local_50);
        if (((sVar4 + 2 < sVar5) &&
            (pvVar6 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                 (size_type)in_stack_fffffffffffffed8), *pvVar6 == '#')) &&
           ((pvVar6 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                 (size_type)in_stack_fffffffffffffed8), *pvVar6 == '#' &&
            (pvVar6 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                 (size_type)in_stack_fffffffffffffed8), *pvVar6 == ']')))) {
          bVar1 = false;
        }
      }
      else {
        pvVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            (size_type)in_stack_fffffffffffffed8);
        if (*pvVar6 == '#') {
          sVar5 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(&local_50)
          ;
          if (((sVar4 + 2 < sVar5) &&
              (pvVar6 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                        operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                   (size_type)in_stack_fffffffffffffed8), *pvVar6 == '#')) &&
             (in_stack_ffffffffffffff00 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              (size_type)in_stack_fffffffffffffed8),
             *(char *)&(((_Vector_base<int,_std::allocator<int>_> *)
                        &in_stack_ffffffffffffff00->_M_dataplus)->_M_impl).super__Vector_impl_data.
                       _M_start == '[')) {
            bVar1 = true;
          }
        }
        else {
          in_stack_fffffffffffffef8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            (size_type)in_stack_fffffffffffffed8);
          if (*(char *)&(in_stack_fffffffffffffef8->_M_dataplus)._M_p == '!') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(in_stack_fffffffffffffef8,(size_type)in_stack_fffffffffffffef0,
                   (size_type)in_stack_fffffffffffffee8);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffed8);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(in_stack_fffffffffffffef0,(char)((ulong)in_stack_fffffffffffffee8 >> 0x38));
          }
          else {
            pvVar7 = CLI::std::vector<int,_std::allocator<int>_>::operator[](in_RDI,0);
            *pvVar7 = *pvVar7 + 1;
            local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            while (in_stack_fffffffffffffef0 = local_88,
                  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CLI::std::vector<char,_std::allocator<char>_>::size(local_18),
                  in_stack_fffffffffffffef0 < pbVar8) {
              in_stack_fffffffffffffee8 =
                   CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              (size_type)in_stack_fffffffffffffed8);
              in_stack_fffffffffffffee4 = (int)*in_stack_fffffffffffffee8;
              pvVar9 = CLI::std::vector<char,_std::allocator<char>_>::operator[]
                                 (local_18,(size_type)local_88);
              if (in_stack_fffffffffffffee4 == *pvVar9) {
                pvVar7 = CLI::std::vector<int,_std::allocator<int>_>::operator[]
                                   (in_RDI,(size_type)((long)&(local_88->_M_dataplus)._M_p + 1));
                *pvVar7 = *pvVar7 + 1;
              }
              local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&(local_88->_M_dataplus)._M_p + 1);
            }
          }
        }
      }
    }
  }
  local_19 = 1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  if ((local_19 & 1) == 0) {
    CLI::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0);
  }
  return in_RDI;
}

Assistant:

std::vector<int> AppTextParser::preParseFile(const std::vector<char>& klines)
{
    reset();
    std::vector<int> counts(1 + klines.size());
    std::string str;
    bool inMline{false};
    // count the lines
    while (std::getline(filePtr, str)) {
        if (str.empty()) {
            continue;
        }
        auto firstChar = str.find_first_not_of(" \t\n\r\0");
        if (firstChar == std::string::npos) {
            continue;
        }
        if (inMline) {
            if (firstChar + 2 < str.size()) {
                if ((str[firstChar] == '#') && (str[firstChar + 1] == '#') &&
                    (str[firstChar + 2] == ']')) {
                    inMline = false;
                }
            }
            continue;
        }
        if (str[firstChar] == '#') {
            if (firstChar + 2 < str.size()) {
                if ((str[firstChar + 1] == '#') && (str[firstChar + 2] == '[')) {
                    inMline = true;
                }
            }
            continue;
        }
        if (str[firstChar] == '!') {
            configStr += str.substr(firstChar + 1);
            configStr.push_back('\n');
            continue;
        }

        ++counts[0];
        for (std::size_t ii = 0; ii < klines.size(); ++ii) {
            if (str[firstChar] == klines[ii]) {
                ++counts[ii + 1];
            }
        }
    }
    return counts;
}